

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O2

void plain_array_suite::pop_back(void)

{
  value_type vVar1;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  iterator iVar2;
  iterator iVar3;
  allocator_type local_e9;
  vector<int,_std::allocator<int>_> expect;
  int local_c8 [4];
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  
  span.member.data = array;
  array[0] = 0;
  array[1] = 0;
  array[2] = 0;
  array[3] = 0;
  span.member.cap = 4;
  span.member.size = 0;
  span.member.next = 4;
  vista::circular_view<int,_18446744073709551615UL>::push_back(&span,0xb);
  local_c8[0] = 0xb;
  __l._M_len = 1;
  __l._M_array = local_c8;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l,&local_e9);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar3 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x602,"void plain_array_suite::pop_back()",iVar2,iVar3,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  vVar1 = vista::circular_view<int,_18446744073709551615UL>::pop_back(&span);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,vVar1);
  local_c8[0] = 0xb;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.pop_back()","11",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x604,"void plain_array_suite::pop_back()",&expect,local_c8);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar3 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x608,"void plain_array_suite::pop_back()",iVar2,iVar3,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)0x0,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)0x0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  vista::circular_view<int,_18446744073709551615UL>::push_back(&span,0xb);
  vista::circular_view<int,_18446744073709551615UL>::push_back(&span,0x16);
  local_c8[0] = 0xb;
  local_c8[1] = 0x16;
  __l_00._M_len = 2;
  __l_00._M_array = local_c8;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l_00,&local_e9);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar3 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x60f,"void plain_array_suite::pop_back()",iVar2,iVar3,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  vVar1 = vista::circular_view<int,_18446744073709551615UL>::pop_back(&span);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,vVar1);
  local_c8[0] = 0x16;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.pop_back()","22",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x611,"void plain_array_suite::pop_back()",&expect,local_c8);
  local_c8[0] = 0xb;
  __l_01._M_len = 1;
  __l_01._M_array = local_c8;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l_01,&local_e9);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar3 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x615,"void plain_array_suite::pop_back()",iVar2,iVar3,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  vista::circular_view<int,_18446744073709551615UL>::push_back(&span,0x21);
  vista::circular_view<int,_18446744073709551615UL>::push_back(&span,0x2c);
  vista::circular_view<int,_18446744073709551615UL>::push_back(&span,0x37);
  local_c8[0] = 0xb;
  local_c8[1] = 0x21;
  local_c8[2] = 0x2c;
  local_c8[3] = 0x37;
  __l_02._M_len = 4;
  __l_02._M_array = local_c8;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l_02,&local_e9);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar3 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x61d,"void plain_array_suite::pop_back()",iVar2,iVar3,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  vVar1 = vista::circular_view<int,_18446744073709551615UL>::pop_back(&span);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,vVar1);
  local_c8[0] = 0x37;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.pop_back()","55",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x61f,"void plain_array_suite::pop_back()",&expect,local_c8);
  local_c8[0] = 0xb;
  local_c8[1] = 0x21;
  local_c8[2] = 0x2c;
  __l_03._M_len = 3;
  __l_03._M_array = local_c8;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l_03,&local_e9);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar3 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x623,"void plain_array_suite::pop_back()",iVar2,iVar3,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void pop_back()
{
    int array[4] = {};
    circular_view<int> span(array);
    span.push_back(11);
    {
        std::vector<int> expect = { 11 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    BOOST_TEST_EQ(span.pop_back(), 11);
    {
        std::vector<int> expect = { };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.push_back(11);
    span.push_back(22);
    {
        std::vector<int> expect = { 11, 22 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    BOOST_TEST_EQ(span.pop_back(), 22);
    {
        std::vector<int> expect = { 11 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.push_back(33);
    span.push_back(44);
    span.push_back(55);
    {
        std::vector<int> expect = { 11, 33, 44, 55 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    BOOST_TEST_EQ(span.pop_back(), 55);
    {
        std::vector<int> expect = { 11, 33, 44 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}